

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cellml_1_1.cpp
# Opt level: O0

void __thiscall
ParserTransform_parseModelWithCMeta10Id_Test::~ParserTransform_parseModelWithCMeta10Id_Test
          (ParserTransform_parseModelWithCMeta10Id_Test *this)

{
  ParserTransform_parseModelWithCMeta10Id_Test *this_local;
  
  ~ParserTransform_parseModelWithCMeta10Id_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ParserTransform, parseModelWithCMeta10Id)
{
    const std::string n = "name";
    const std::string in =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/1.1#\" xmlns:cmeta=\"http://www.cellml.org/metadata/1.0#\" name=\"name\" cmeta:id=\"great_id\"/>\n";

    libcellml::ParserPtr parser = libcellml::Parser::create(false);
    libcellml::ModelPtr model = parser->parseModel(in);
    EXPECT_EQ(n, model->name());
}